

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v5::internal::
parse_format_string<false,char,fmt::v5::format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>&>
          (internal *this,basic_string_view<char> format_str,
          format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>,_char,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
          *handler)

{
  null_terminating_iterator<char> it_00;
  bool bVar1;
  char cVar2;
  char *pcVar3;
  size_t sVar4;
  char *end_00;
  iterator iVar5;
  char *local_70;
  char *local_68;
  undefined1 local_60 [8];
  null_terminating_iterator<char> it;
  id_adapter<fmt::v5::format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>,_char,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>_&,_char>
  iStack_48;
  char c;
  char *local_40;
  char *p;
  char *end;
  char *begin;
  writer write;
  format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>,_char,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  *handler_local;
  basic_string_view<char> format_str_local;
  
  begin = (char *)format_str.size_;
  format_str_local.data_ = format_str.data_;
  write.handler_ =
       (format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>,_char,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)begin;
  handler_local =
       (format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>,_char,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)this;
  pcVar3 = basic_string_view<char>::data((basic_string_view<char> *)&handler_local);
  end = pcVar3;
  sVar4 = basic_string_view<char>::size((basic_string_view<char> *)&handler_local);
  p = pcVar3 + sVar4;
  do {
    if (end == p) {
      return;
    }
    local_40 = end;
    if ((*end != '{') && (bVar1 = find<false,char,char_const*>(end,p,'{',&local_40), !bVar1)) {
      parse_format_string<false,_char,_fmt::v5::format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>,_char,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>_&>
      ::writer::operator()((writer *)&begin,end,p);
      return;
    }
    parse_format_string<false,_char,_fmt::v5::format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>,_char,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>_&>
    ::writer::operator()((writer *)&begin,end,local_40);
    pcVar3 = local_40 + 1;
    if (pcVar3 == p) {
      local_40 = pcVar3;
      error_handler::on_error((error_handler *)write.handler_,"invalid format string");
      return;
    }
    if (*pcVar3 == '}') {
      local_40 = pcVar3;
      format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>,_char,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
      ::on_arg_id(write.handler_);
      format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>,_char,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
      ::on_replacement_field(write.handler_,local_40);
    }
    else if (*pcVar3 == '{') {
      end_00 = local_40 + 2;
      local_40 = pcVar3;
      format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>,_char,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
      ::on_text(write.handler_,pcVar3,end_00);
    }
    else {
      iStack_48.handler = write.handler_;
      local_40 = pcVar3;
      local_40 = parse_arg_id<char,fmt::v5::internal::id_adapter<fmt::v5::format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>&,char>>
                           (pcVar3,p,&stack0xffffffffffffffb8);
      if (local_40 == p) {
        it.end_._7_1_ = '\0';
      }
      else {
        it.end_._7_1_ = *local_40;
      }
      if (it.end_._7_1_ == '}') {
        format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>,_char,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        ::on_replacement_field(write.handler_,local_40);
      }
      else {
        if (it.end_._7_1_ != ':') {
          error_handler::on_error((error_handler *)write.handler_,"missing \'}\' in format string");
          return;
        }
        null_terminating_iterator<char>::null_terminating_iterator
                  ((null_terminating_iterator<char> *)local_60,local_40 + 1,p);
        iVar5.end_ = it.ptr_;
        iVar5.ptr_ = (char *)local_60;
        iVar5 = format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>,_char,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
                ::on_format_specs(write.handler_,iVar5);
        local_70 = iVar5.ptr_;
        local_60 = (undefined1  [8])local_70;
        local_68 = iVar5.end_;
        it.ptr_ = local_68;
        cVar2 = null_terminating_iterator<char>::operator*
                          ((null_terminating_iterator<char> *)local_60);
        if (cVar2 != '}') {
          error_handler::on_error((error_handler *)write.handler_,"unknown format specifier");
          return;
        }
        it_00.end_ = it.ptr_;
        it_00.ptr_ = (char *)local_60;
        local_40 = pointer_from<char>(it_00);
      }
    }
    end = local_40 + 1;
  } while( true );
}

Assistant:

FMT_CONSTEXPR void parse_format_string(
        basic_string_view<Char> format_str, Handler &&handler) {
  struct writer {
    FMT_CONSTEXPR void operator()(const Char *begin, const Char *end) {
      if (begin == end) return;
      for (;;) {
        const Char *p = FMT_NULL;
        if (!find<IS_CONSTEXPR>(begin, end, '}', p))
          return handler_.on_text(begin, end);
        ++p;
        if (p == end || *p != '}')
          return handler_.on_error("unmatched '}' in format string");
        handler_.on_text(begin, p);
        begin = p + 1;
      }
    }
    Handler &handler_;
  } write{handler};
  auto begin = format_str.data(), end = begin + format_str.size();
  while (begin != end) {
    // Doing two passes with memchr (one for '{' and another for '}') is up to
    // 2.5x faster than the naive one-pass implementation on big format strings.
    const Char *p = begin;
    if (*begin != '{' && !find<IS_CONSTEXPR>(begin, end, '{', p))
      return write(begin, end);
    write(begin, p);
    ++p;
    if (p == end)
      return handler.on_error("invalid format string");
    if (*p == '}') {
      handler.on_arg_id();
      handler.on_replacement_field(p);
    } else if (*p == '{') {
      handler.on_text(p, p + 1);
    } else {
      p = parse_arg_id(p, end, id_adapter<Handler, Char>{handler});
      Char c = p != end ? *p : 0;
      if (c == '}') {
        handler.on_replacement_field(p);
      } else if (c == ':') {
        internal::null_terminating_iterator<Char> it(p + 1, end);
        it = handler.on_format_specs(it);
        if (*it != '}')
          return handler.on_error("unknown format specifier");
        p = pointer_from(it);
      } else {
        return handler.on_error("missing '}' in format string");
      }
    }
    begin = p + 1;
  }
}